

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O0

void nvpair_init_datasize(nvpair_t *nvp)

{
  size_t sVar1;
  nvpair_t *nvp_local;
  
  if (nvp == (nvpair_t *)0x0) {
    __assert_fail("(nvp) != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x261,"void nvpair_init_datasize(nvpair_t *)");
  }
  if (nvp->nvp_magic != 0x6e7670) {
    __assert_fail("(nvp)->nvp_magic == 0x6e7670",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x261,"void nvpair_init_datasize(nvpair_t *)");
  }
  if (nvp->nvp_type == 5) {
    if (nvp->nvp_data == 0) {
      nvp->nvp_datasize = 0;
    }
    else {
      sVar1 = nvlist_size((nvlist_t *)nvp->nvp_data);
      nvp->nvp_datasize = sVar1;
    }
  }
  return;
}

Assistant:

void
nvpair_init_datasize(nvpair_t *nvp)
{

	NVPAIR_ASSERT(nvp);

	if (nvp->nvp_type == NV_TYPE_NVLIST) {
		if (nvp->nvp_data == 0) {
			nvp->nvp_datasize = 0;
		} else {
			nvp->nvp_datasize =
			    nvlist_size((const nvlist_t *)(intptr_t)nvp->nvp_data);
		}
	}
}